

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void prod_histo(qnode_ptr_t f,char *c_fn,char *h_fn,int nbin,float incr,float *ttl_err,
               float *ttl_std,float *dens)

{
  disp_field512_t *padVar1;
  qnode_ptr_t q;
  disp_field512_t *padVar2;
  long lVar3;
  FILE *__stream;
  int iVar4;
  int *piVar5;
  histo_t *phVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined4 in_XMM0_Db;
  float fVar19;
  float fVar20;
  float fVar21;
  char *local_9a0;
  histo_t histo1 [100];
  histo_t c_histo1 [100];
  
  uVar15 = (ulong)(uint)nbin;
  local_9a0 = h_fn;
  q = create_node(0,f->res,f->sizx,f->sizy,f->sizz,0);
  padVar2 = (disp_field512_t *)malloc(0xc3080);
  q->flow_ptr = padVar2;
  load_velocity(q,c_fn);
  fVar16 = (float)nbin;
  for (lVar3 = 8; lVar3 != 0x4b8; lVar3 = lVar3 + 0xc) {
    *(undefined8 *)((long)histo1 + lVar3 + -8) = 0;
    *(undefined4 *)((long)&histo1[0].std + lVar3) = 0;
    *(undefined8 *)((long)&histo1[99].avg + lVar3) = 0;
    *(undefined4 *)((long)&c_histo1[0].std + lVar3) = 0;
  }
  *ttl_err = 0.0;
  *ttl_std = 0.0;
  fVar17 = fVar16 * (float)(double)CONCAT44(in_XMM0_Db,incr);
  iVar12 = 0;
  fVar19 = 0.0;
  iVar9 = 0;
  for (iVar14 = KERNEL_Y + 9; iVar7 = KERNEL_Y, iVar13 = f->sizy, iVar14 < (iVar13 - KERNEL_Y) + -9;
      iVar14 = iVar14 + 1) {
    iVar7 = KERNEL_X;
    for (iVar13 = KERNEL_X + 9; iVar13 < (f->sizx - iVar7) + -9; iVar13 = iVar13 + 1) {
      iVar4 = f->res * iVar14 + iVar13;
      padVar1 = f->flow_ptr;
      fVar18 = (*padVar1)[iVar4].x;
      if (((fVar18 != -100.0) || (NAN(fVar18))) &&
         ((fVar18 = (*padVar1)[iVar4].y, fVar18 != 100.0 || (NAN(fVar18))))) {
        iVar7 = (int)(((*f->param_ptr[f->sizz / 2])[iVar4].mag / fVar17) * fVar16);
        fVar18 = psi_error((*padVar1)[iVar4],(*padVar2)[q->res * iVar14 + iVar13]);
        if (nbin <= iVar7) {
          iVar7 = nbin + -1;
        }
        lVar3 = (long)iVar7;
        histo1[lVar3].avg = fVar18 + histo1[lVar3].avg;
        histo1[lVar3].freq = histo1[lVar3].freq + 1;
        fVar19 = fVar19 + fVar18;
        piVar5 = &c_histo1[0].freq;
        for (lVar10 = 0; lVar10 <= lVar3; lVar10 = lVar10 + 1) {
          piVar5[-1] = (int)((float)piVar5[-1] + fVar18);
          *piVar5 = *piVar5 + 1;
          piVar5 = piVar5 + 3;
        }
        iVar12 = iVar12 + 1;
        iVar7 = KERNEL_X;
      }
      iVar9 = iVar9 + 1;
    }
  }
  fVar21 = (float)iVar12;
  fVar18 = 0.0;
  if (iVar9 != 0) {
    fVar18 = fVar21 / (float)iVar9;
  }
  *dens = fVar18;
  *ttl_err = fVar19 / fVar21;
  lVar3 = 0;
  uVar11 = 0;
  if (0 < nbin) {
    uVar11 = uVar15;
  }
  for (; uVar11 * 0xc - lVar3 != 0; lVar3 = lVar3 + 0xc) {
    iVar14 = *(int *)((long)&histo1[0].freq + lVar3);
    if (iVar14 != 0) {
      *(float *)((long)&histo1[0].avg + lVar3) =
           *(float *)((long)&histo1[0].avg + lVar3) / (float)iVar14;
    }
    iVar14 = *(int *)((long)&c_histo1[0].freq + lVar3);
    if (iVar14 != 0) {
      *(float *)((long)&c_histo1[0].avg + lVar3) =
           *(float *)((long)&c_histo1[0].avg + lVar3) / (float)iVar14;
    }
  }
  iVar14 = iVar7 + 9;
  for (; iVar14 < (iVar13 - iVar7) + -9; iVar14 = iVar14 + 1) {
    iVar12 = KERNEL_X;
    for (iVar9 = KERNEL_X + 9; iVar9 < (f->sizx - iVar12) + -9; iVar9 = iVar9 + 1) {
      iVar13 = f->res * iVar14 + iVar9;
      padVar1 = f->flow_ptr;
      fVar18 = (*padVar1)[iVar13].x;
      if (((fVar18 != -100.0) || (NAN(fVar18))) &&
         ((fVar18 = (*padVar1)[iVar13].y, fVar18 != 100.0 || (NAN(fVar18))))) {
        iVar12 = (int)(((*f->param_ptr[f->sizz / 2])[iVar13].mag / fVar17) * fVar16);
        fVar18 = psi_error((*padVar1)[iVar13],(*padVar2)[q->res * iVar14 + iVar9]);
        fVar20 = fVar19 / fVar21 - fVar18;
        if (nbin <= iVar12) {
          iVar12 = nbin + -1;
        }
        *ttl_std = *ttl_std + fVar20 * fVar20;
        lVar3 = (long)iVar12;
        fVar20 = histo1[lVar3].avg - fVar18;
        histo1[lVar3].std = histo1[lVar3].std + fVar20 * fVar20;
        phVar6 = c_histo1;
        for (lVar10 = 0; iVar12 = KERNEL_X, lVar10 <= lVar3; lVar10 = lVar10 + 1) {
          fVar20 = phVar6->avg - fVar18;
          phVar6->std = phVar6->std + fVar20 * fVar20;
          phVar6 = phVar6 + 1;
        }
      }
    }
    iVar13 = f->sizy;
    iVar7 = KERNEL_Y;
  }
  fVar21 = *ttl_std / fVar21;
  if (fVar21 < 0.0) {
    fVar21 = sqrtf(fVar21);
  }
  else {
    fVar21 = SQRT(fVar21);
  }
  *ttl_std = fVar21;
  for (lVar3 = 0; uVar11 * 0xc != lVar3; lVar3 = lVar3 + 0xc) {
    iVar14 = *(int *)((long)&histo1[0].freq + lVar3);
    if (iVar14 != 0) {
      fVar19 = *(float *)((long)&histo1[0].std + lVar3) / (float)iVar14;
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      *(float *)((long)&histo1[0].std + lVar3) = fVar19;
    }
    iVar14 = *(int *)((long)&c_histo1[0].freq + lVar3);
    if (iVar14 != 0) {
      fVar19 = *(float *)((long)&c_histo1[0].std + lVar3) / (float)iVar14;
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      *(float *)((long)&c_histo1[0].std + lVar3) = fVar19;
    }
  }
  __stream = fopen(local_9a0,"w");
  if (__stream == (FILE *)0x0) {
    error(7);
  }
  fprintf(__stream,"%2d\n",2);
  fprintf(__stream,"%3d\n",uVar15);
  fprintf(__stream,"%5.7f\n");
  fVar16 = fVar17 / fVar16;
  piVar5 = &histo1[0].freq;
  for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
            (double)((float)(int)uVar8 * fVar16) + (double)fVar16 * 0.5,(double)(float)piVar5[-1],
            (double)((histo_t *)(piVar5 + -2))->std,
            (double)((float)*piVar5 / (float)c_histo1[0].freq));
    piVar5 = piVar5 + 3;
  }
  fwrite("\n\n\n",3,1,__stream);
  fprintf(__stream,"%3d\n",uVar15);
  fprintf(__stream,"%5.7f\n",(double)fVar17 - (double)(float)(double)CONCAT44(in_XMM0_Db,incr) * 0.5
         );
  piVar5 = &c_histo1[0].freq;
  for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
    fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
            (double)((float)(int)uVar15 * fVar16) + (double)fVar16 * 0.5,(double)(float)piVar5[-1],
            (double)((histo_t *)(piVar5 + -2))->std,
            (double)((float)*piVar5 / (float)c_histo1[0].freq));
    piVar5 = piVar5 + 3;
  }
  fclose(__stream);
  return;
}

Assistant:

void prod_histo(f,c_fn,h_fn,nbin,incr,ttl_err,ttl_std,dens)
qnode_ptr_t f ;
string c_fn, h_fn ;
float incr, *ttl_err, *ttl_std, *dens ;
int nbin ;

{ qnode_ptr_t create_node(), q ;
  disp_vect_t u ;
  histo_t histo1[N_BINS], c_histo1[N_BINS] ;
  float psi_error(), max_mag, mag, err, avg_err, density, t, x, y ;
  int fdf, nbytes, i, j, k, index1, ttl_freq, abs_freq ;
  FILE *fdp ;
  extern int KERNEL_X, KERNEL_Y ;

  q = create_node(0,f->res,f->sizx,f->sizy,f->sizz,0) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
  load_velocity(q,c_fn) ;

  max_mag = incr*(float)nbin ;
  for (i = 0 ; i < N_BINS ; i++) {
    histo1[i].avg = 0.0 ;
    histo1[i].std = 0.0 ;
    histo1[i].freq = 0 ;
    c_histo1[i].avg = 0.0 ;
    c_histo1[i].std = 0.0 ;
    c_histo1[i].freq = 0 ;
  }
  abs_freq = 0 ;
  ttl_freq = 0 ;
  avg_err = 0.0 ;
  *ttl_err = 0.0 ;
  *ttl_std = 0.0 ;

  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx -  KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      abs_freq++ ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        avg_err += err ;
        ttl_freq++ ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].avg += err ;
        histo1[index1].freq++ ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].avg += err ;
          c_histo1[k].freq++ ;
        }
      }
    }
  }
  if (abs_freq != 0) {
    *dens = (float)ttl_freq/(float)abs_freq ;
  }
  else {
    *dens = 0.0 ;
  }
  *ttl_err = avg_err/(float)ttl_freq ;
  avg_err = *ttl_err ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].avg /= (float)histo1[i].freq ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].avg /= (float)c_histo1[i].freq ;
    }
  }
  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx - KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        *ttl_std += pow(avg_err - err,2.0) ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].std += pow(histo1[index1].avg - err,2.0) ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].std += pow(c_histo1[k].avg - err,2.0) ;
        }
      }
    }
  }
  *ttl_std = sqrt(*ttl_std/(float)ttl_freq) ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].std = sqrt(histo1[i].std/(float)histo1[i].freq) ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].std = sqrt(c_histo1[i].std/(float)c_histo1[i].freq) ;
    }
  }
  if ((fdp = fopen(h_fn,"w")) == NULL) {
    error(7) ;
  }

  density = c_histo1[0].freq ;
  fprintf(fdp,"%2d\n",N_HISTO) ;
  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    histo1[i].avg, histo1[i].std, (float)histo1[i].freq/density) ;
  }
  fprintf(fdp,"\n\n\n") ;

  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    c_histo1[i].avg, c_histo1[i].std, (float)c_histo1[i].freq/density) ;
  }
  fclose(fdp) ;
}